

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1531.c
# Opt level: O0

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  timeval tVar5;
  timeval older;
  timeval older_00;
  undefined1 local_250 [8];
  timeval wait;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  long lStack_210;
  uint __i;
  long curl_timeo;
  undefined1 local_200 [4];
  int maxfd;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  CURLMcode mc;
  int rc;
  timeval timeout;
  __time_t _Stack_50;
  CURLcode ec;
  __suseconds_t local_48;
  int local_40;
  undefined1 local_3c [4];
  int res;
  int msgs_left;
  CURLMsg *msg;
  undefined8 uStack_28;
  int still_running;
  CURLM *multi_handle;
  CURL *easy;
  char *URL_local;
  
  local_40 = 0;
  easy = (CURL *)URL;
  tVar5 = tutil_tvnow();
  _Stack_50 = tVar5.tv_sec;
  tv_test_start.tv_sec = _Stack_50;
  local_48 = tVar5.tv_usec;
  tv_test_start.tv_usec = local_48;
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 != 0) {
    uVar3 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1531.c"
                  ,0x2c,iVar2,uVar3);
    local_40 = iVar2;
  }
  if (local_40 == 0) {
    multi_handle = (CURLM *)curl_easy_init();
    uStack_28 = curl_multi_init();
    curl_multi_add_handle(uStack_28,multi_handle);
    curl_easy_setopt(multi_handle,0x2712,easy);
    curl_easy_setopt(multi_handle,0x75a8,8);
    curl_easy_setopt(multi_handle,0x271f,".abc");
    curl_multi_perform(uStack_28,(long)&msg + 4);
    join_0x00000010_0x00000000_ = tutil_tvnow();
    tVar5.tv_usec = tv_test_start.tv_usec;
    tVar5.tv_sec = tv_test_start.tv_sec;
    lVar4 = tutil_tvdiff(join_0x00000010_0x00000000_,tVar5);
    if (60000 < lVar4) {
      curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1531.c"
                    ,0x40);
      local_40 = 0x7d;
    }
    if (local_40 == 0) {
      do {
        curl_timeo._4_4_ = -1;
        lStack_210 = -1;
        for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
          fdwrite.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
        }
        for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
          fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
        }
        wait.tv_usec = (__suseconds_t)local_200;
        for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
          *(undefined8 *)(wait.tv_usec + (ulong)__arr_2._4_4_ * 8) = 0;
        }
        _mc = 1;
        timeout.tv_sec = 0;
        curl_multi_timeout(uStack_28,&stack0xfffffffffffffdf0);
        if (-1 < lStack_210) {
          _mc = lStack_210 / 1000;
          if (_mc < 2) {
            timeout.tv_sec = (lStack_210 % 1000) * 1000;
          }
          else {
            _mc = 1;
          }
        }
        iVar2 = curl_multi_fdset(uStack_28,fdwrite.__fds_bits + 0xf,fdexcep.__fds_bits + 0xf,
                                 local_200,(long)&curl_timeo + 4);
        if (iVar2 != 0) {
          curl_mfprintf(_stderr,"curl_multi_fdset() failed, code %d.\n",iVar2);
          break;
        }
        if (curl_timeo._4_4_ == -1) {
          local_250 = (undefined1  [8])0x0;
          wait.tv_sec = 100000;
          fdread.__fds_bits[0xf]._4_4_ =
               select(0,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)0x0,(timeval *)local_250);
        }
        else {
          fdread.__fds_bits[0xf]._4_4_ =
               select(curl_timeo._4_4_ + 1,(fd_set *)(fdwrite.__fds_bits + 0xf),
                      (fd_set *)(fdexcep.__fds_bits + 0xf),(fd_set *)local_200,(timeval *)&mc);
        }
        if (fdread.__fds_bits[0xf]._4_4_ != -1) {
          curl_multi_perform(uStack_28,(long)&msg + 4);
        }
        tVar5 = tutil_tvnow();
        older.tv_usec = tv_test_start.tv_usec;
        older.tv_sec = tv_test_start.tv_sec;
        lVar4 = tutil_tvdiff(tVar5,older);
        if (60000 < lVar4) {
          curl_mfprintf(_stderr,
                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1531.c"
                        ,0x87);
          local_40 = 0x7d;
        }
        if (local_40 != 0) goto LAB_001027c1;
      } while (msg._4_4_ != 0);
      do {
        _res = (int *)curl_multi_info_read(uStack_28,local_3c);
        if ((_res != (int *)0x0) && (*_res == 1)) {
          curl_mprintf("HTTP transfer completed with status %d\n",_res[4]);
          break;
        }
        tVar5 = tutil_tvnow();
        older_00.tv_usec = tv_test_start.tv_usec;
        older_00.tv_sec = tv_test_start.tv_sec;
        lVar4 = tutil_tvdiff(tVar5,older_00);
        if (60000 < lVar4) {
          curl_mfprintf(_stderr,
                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1531.c"
                        ,0x92);
          local_40 = 0x7d;
        }
        if ((local_40 != 0) || (_res == (int *)0x0)) break;
      } while( true );
    }
LAB_001027c1:
    curl_multi_cleanup(uStack_28);
    curl_easy_cleanup(multi_handle);
    curl_global_cleanup();
    URL_local._4_4_ = local_40;
  }
  else {
    URL_local._4_4_ = local_40;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURL *easy;
  CURLM *multi_handle;
  int still_running; /* keep number of running handles */
  CURLMsg *msg; /* for picking up messages with the transfer status */
  int msgs_left; /* how many messages are left */
  int res = CURLE_OK;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  /* Allocate one CURL handle per transfer */
  easy = curl_easy_init();

  /* init a multi stack */
  multi_handle = curl_multi_init();

  /* add the individual transfer */
  curl_multi_add_handle(multi_handle, easy);

  /* set the options (I left out a few, you'll get the point anyway) */
  curl_easy_setopt(easy, CURLOPT_URL, URL);
  curl_easy_setopt(easy, CURLOPT_POSTFIELDSIZE_LARGE,
                   (curl_off_t)testDataSize);
  curl_easy_setopt(easy, CURLOPT_POSTFIELDS, testData);

  /* we start some action by calling perform right away */
  curl_multi_perform(multi_handle, &still_running);

  abort_on_test_timeout();

  do {
    struct timeval timeout;
    int rc; /* select() return code */
    CURLMcode mc; /* curl_multi_fdset() return code */

    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -1;

    long curl_timeo = -1;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    /* set a suitable timeout to play around with */
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    curl_multi_timeout(multi_handle, &curl_timeo);
    if(curl_timeo >= 0) {
      timeout.tv_sec = curl_timeo / 1000;
      if(timeout.tv_sec > 1)
        timeout.tv_sec = 1;
      else
        timeout.tv_usec = (curl_timeo % 1000) * 1000;
    }

    /* get file descriptors from the transfers */
    mc = curl_multi_fdset(multi_handle, &fdread, &fdwrite, &fdexcep, &maxfd);

    if(mc != CURLM_OK) {
      fprintf(stderr, "curl_multi_fdset() failed, code %d.\n", mc);
      break;
    }

    /* On success the value of maxfd is guaranteed to be >= -1. We call
       select(maxfd + 1, ...); specially in case of (maxfd == -1) there are
       no fds ready yet so we call select(0, ...) --or Sleep() on Windows--
       to sleep 100ms, which is the minimum suggested value in the
       curl_multi_fdset() doc. */

    if(maxfd == -1) {
#ifdef _WIN32
      Sleep(100);
      rc = 0;
#else
      /* Portable sleep for platforms other than Windows. */
      struct timeval wait = { 0, 100 * 1000 }; /* 100ms */
      rc = select(0, NULL, NULL, NULL, &wait);
#endif
    }
    else {
      /* Note that on some platforms 'timeout' may be modified by select().
         If you need access to the original value save a copy beforehand. */
      rc = select(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);
    }

    switch(rc) {
    case -1:
      /* select error */
      break;
    case 0: /* timeout */
    default: /* action */
      curl_multi_perform(multi_handle, &still_running);
      break;
    }

    abort_on_test_timeout();
  } while(still_running);

  /* See how the transfers went */
  do {
    msg = curl_multi_info_read(multi_handle, &msgs_left);
    if(msg && msg->msg == CURLMSG_DONE) {
      printf("HTTP transfer completed with status %d\n", msg->data.result);
      break;
    }

    abort_on_test_timeout();
  } while(msg);

test_cleanup:
  curl_multi_cleanup(multi_handle);

  /* Free the CURL handles */
  curl_easy_cleanup(easy);
  curl_global_cleanup();

  return res;
}